

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R4_knapsack.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int wt [4];
  int val [4];
  
  val[0] = 6;
  val[1] = 10;
  val[2] = 0xc;
  val[3] = 0;
  wt[0] = 1;
  wt[1] = 2;
  wt[2] = 3;
  wt[3] = 0;
  uVar1 = knap_sack(3,5,wt,val);
  printf("Final result: %d\n",(ulong)uVar1);
  return 0;
}

Assistant:

int main() {
  int val[] = {6, 10, 12, 0};
  int wt[] = {1, 2, 3, 0};
  int wu = 5;

  int n = sizeof(val) / sizeof(val[0]) - 1;
  printf("Final result: %d\n", knap_sack(n, wu, wt, val));

  return 0;
}